

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_registrymanager.c
# Opt level: O1

IOTHUB_REGISTRYMANAGER_RESULT
IoTHubRegistryManager_UpdateDeviceOrModule
          (IOTHUB_REGISTRYMANAGER_HANDLE registryManagerHandle,
          IOTHUB_REGISTRY_DEVICE_OR_MODULE_UPDATE *deviceOrModuleUpdate)

{
  IOTHUB_REGISTRYMANAGER_AUTH_METHOD IVar1;
  IOTHUB_REGISTRYMANAGER_RESULT IVar2;
  LOGGER_LOG p_Var3;
  IOTHUB_DEVICE_OR_MODULE *deviceOrModuleInfo;
  BUFFER_HANDLE deviceJsonBuffer;
  BUFFER_HANDLE responseBuffer;
  int iVar4;
  char *pcVar5;
  
  if (registryManagerHandle == (IOTHUB_REGISTRYMANAGER_HANDLE)0x0 ||
      deviceOrModuleUpdate == (IOTHUB_REGISTRY_DEVICE_OR_MODULE_UPDATE *)0x0) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 == (LOGGER_LOG)0x0) {
      return IOTHUB_REGISTRYMANAGER_INVALID_ARG;
    }
    pcVar5 = "Input parameter cannot be NULL";
    iVar4 = 0x67a;
LAB_0014af7a:
    (*p_Var3)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
              ,"IoTHubRegistryManager_UpdateDeviceOrModule",iVar4,1,pcVar5);
    return IOTHUB_REGISTRYMANAGER_INVALID_ARG;
  }
  pcVar5 = deviceOrModuleUpdate->deviceId;
  if (pcVar5 == (char *)0x0) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 == (LOGGER_LOG)0x0) {
      return IOTHUB_REGISTRYMANAGER_INVALID_ARG;
    }
    pcVar5 = "deviceId cannot be NULL";
    iVar4 = 0x681;
    goto LAB_0014af7a;
  }
  IVar1 = deviceOrModuleUpdate->authMethod;
  if (IOTHUB_REGISTRYMANAGER_AUTH_NONE < IVar1) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 == (LOGGER_LOG)0x0) {
      return IOTHUB_REGISTRYMANAGER_INVALID_ARG;
    }
    pcVar5 = "Invalid authorization type specified";
    iVar4 = 0x686;
    goto LAB_0014af7a;
  }
  deviceOrModuleInfo = (IOTHUB_DEVICE_OR_MODULE *)malloc(0xa0);
  if (deviceOrModuleInfo == (IOTHUB_DEVICE_OR_MODULE *)0x0) {
    p_Var3 = xlogging_get_log_function();
    IVar2 = IOTHUB_REGISTRYMANAGER_ERROR;
    if (p_Var3 != (LOGGER_LOG)0x0) {
      (*p_Var3)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                ,"IoTHubRegistryManager_UpdateDeviceOrModule",0x68e,1,
                "Malloc failed for tempDeviceOrModuleInfo");
    }
    goto LAB_0014b068;
  }
  memset(deviceOrModuleInfo,0,0xa0);
  deviceOrModuleInfo->deviceId = pcVar5;
  deviceOrModuleInfo->primaryKey = deviceOrModuleUpdate->primaryKey;
  deviceOrModuleInfo->secondaryKey = deviceOrModuleUpdate->secondaryKey;
  deviceOrModuleInfo->authMethod = IVar1;
  deviceOrModuleInfo->status = deviceOrModuleUpdate->status;
  deviceOrModuleInfo->moduleId = deviceOrModuleUpdate->moduleId;
  deviceOrModuleInfo->iotEdge_capable = deviceOrModuleUpdate->iotEdge_capable;
  deviceOrModuleInfo->managedBy = deviceOrModuleUpdate->managedBy;
  deviceJsonBuffer = constructDeviceOrModuleJson(deviceOrModuleInfo);
  if (deviceJsonBuffer == (BUFFER_HANDLE)0x0) {
    p_Var3 = xlogging_get_log_function();
    IVar2 = IOTHUB_REGISTRYMANAGER_JSON_ERROR;
    if (p_Var3 != (LOGGER_LOG)0x0) {
      pcVar5 = "Json creation failed";
      responseBuffer = (BUFFER_HANDLE)0x0;
      iVar4 = 0x6a2;
      goto LAB_0014b03a;
    }
LAB_0014b047:
    responseBuffer = (BUFFER_HANDLE)0x0;
  }
  else {
    responseBuffer = BUFFER_new();
    if (responseBuffer == (BUFFER_HANDLE)0x0) {
      p_Var3 = xlogging_get_log_function();
      IVar2 = IOTHUB_REGISTRYMANAGER_ERROR;
      if (p_Var3 == (LOGGER_LOG)0x0) goto LAB_0014b047;
      pcVar5 = "BUFFER_new failed for responseBuffer";
      responseBuffer = (BUFFER_HANDLE)0x0;
      iVar4 = 0x6a7;
LAB_0014b03a:
      (*p_Var3)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                ,"IoTHubRegistryManager_UpdateDeviceOrModule",iVar4,1,pcVar5);
    }
    else {
      IVar2 = sendHttpRequestCRUD(registryManagerHandle,IOTHUB_REQUEST_UPDATE,
                                  deviceOrModuleUpdate->deviceId,deviceOrModuleUpdate->moduleId,
                                  deviceJsonBuffer,0,responseBuffer);
      if (IVar2 == IOTHUB_REGISTRYMANAGER_ERROR) {
        p_Var3 = xlogging_get_log_function();
        IVar2 = IOTHUB_REGISTRYMANAGER_ERROR;
        if (p_Var3 != (LOGGER_LOG)0x0) {
          pcVar5 = "Failure sending HTTP request for update device";
          iVar4 = 0x6ac;
          goto LAB_0014b03a;
        }
      }
    }
  }
  if (deviceJsonBuffer != (BUFFER_HANDLE)0x0) {
    BUFFER_delete(deviceJsonBuffer);
  }
  if (responseBuffer != (BUFFER_HANDLE)0x0) {
    BUFFER_delete(responseBuffer);
  }
LAB_0014b068:
  free(deviceOrModuleInfo);
  return IVar2;
}

Assistant:

IOTHUB_REGISTRYMANAGER_RESULT IoTHubRegistryManager_UpdateDeviceOrModule(IOTHUB_REGISTRYMANAGER_HANDLE registryManagerHandle, IOTHUB_REGISTRY_DEVICE_OR_MODULE_UPDATE* deviceOrModuleUpdate)
{
    IOTHUB_REGISTRYMANAGER_RESULT result;

    if ((registryManagerHandle == NULL) || (deviceOrModuleUpdate == NULL))
    {
        LogError("Input parameter cannot be NULL");
        result = IOTHUB_REGISTRYMANAGER_INVALID_ARG;
    }
    else
    {
        if (deviceOrModuleUpdate->deviceId == NULL)
        {
            LogError("deviceId cannot be NULL");
            result = IOTHUB_REGISTRYMANAGER_INVALID_ARG;
        }
        else if (isAuthTypeAllowed(deviceOrModuleUpdate->authMethod) == false)
        {
            LogError("Invalid authorization type specified");
            result = IOTHUB_REGISTRYMANAGER_INVALID_ARG;
        }
        else
        {
            IOTHUB_DEVICE_OR_MODULE* tempDeviceOrModuleInfo;
            if ((tempDeviceOrModuleInfo = malloc(sizeof(IOTHUB_DEVICE_OR_MODULE))) == NULL)
            {
                LogError("Malloc failed for tempDeviceOrModuleInfo");
                result = IOTHUB_REGISTRYMANAGER_ERROR;
            }
            else
            {
                (void)memset(tempDeviceOrModuleInfo, 0, sizeof(IOTHUB_DEVICE_OR_MODULE));
                tempDeviceOrModuleInfo->deviceId = deviceOrModuleUpdate->deviceId;
                tempDeviceOrModuleInfo->primaryKey = deviceOrModuleUpdate->primaryKey;
                tempDeviceOrModuleInfo->secondaryKey = deviceOrModuleUpdate->secondaryKey;
                tempDeviceOrModuleInfo->authMethod = deviceOrModuleUpdate->authMethod;
                tempDeviceOrModuleInfo->status = deviceOrModuleUpdate->status;
                tempDeviceOrModuleInfo->moduleId = deviceOrModuleUpdate->moduleId;
                tempDeviceOrModuleInfo->iotEdge_capable = deviceOrModuleUpdate->iotEdge_capable;
                tempDeviceOrModuleInfo->managedBy = deviceOrModuleUpdate->managedBy;

                BUFFER_HANDLE deviceJsonBuffer = NULL;
                BUFFER_HANDLE responseBuffer = NULL;

                if ((deviceJsonBuffer = constructDeviceOrModuleJson(tempDeviceOrModuleInfo)) == NULL)
                {
                    LogError("Json creation failed");
                    result = IOTHUB_REGISTRYMANAGER_JSON_ERROR;
                }
                else if ((responseBuffer = BUFFER_new()) == NULL)
                {
                    LogError("BUFFER_new failed for responseBuffer");
                    result = IOTHUB_REGISTRYMANAGER_ERROR;
                }
                else if ((result = sendHttpRequestCRUD(registryManagerHandle, IOTHUB_REQUEST_UPDATE, deviceOrModuleUpdate->deviceId, deviceOrModuleUpdate->moduleId, deviceJsonBuffer, 0, responseBuffer)) == IOTHUB_REGISTRYMANAGER_ERROR)
                {
                    LogError("Failure sending HTTP request for update device");
                }

                if (deviceJsonBuffer != NULL)
                {
                    BUFFER_delete(deviceJsonBuffer);
                }
                if (responseBuffer != NULL)
                {
                    BUFFER_delete(responseBuffer);
                }
            }
            free(tempDeviceOrModuleInfo);
        }
    }
    return result;

}